

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O3

ImVec4_Simple igColorConvertU32ToFloat4_nonUDT2(ImU32 in)

{
  ImVec4_Simple IVar1;
  
  IVar1.x = (float)(in & 0xff) * 0.003921569;
  IVar1.y = (float)(in >> 8 & 0xff) * 0.003921569;
  IVar1.z = (float)(in >> 0x10 & 0xff) * 0.003921569;
  IVar1.w = (float)(in >> 0x18) * 0.003921569;
  return IVar1;
}

Assistant:

CIMGUI_API ImVec4_Simple *_igColorConvertU32ToFloat4_nonUDT2 (ImU32 *larg1) {
  ImVec4_Simple * lresult = (ImVec4_Simple *)0 ;
  ImU32 arg1 ;
  ImVec4_Simple result;
  
  arg1 = *larg1;
  try {
    result = igColorConvertU32ToFloat4_nonUDT2(arg1);
    lresult = new ImVec4_Simple(result);
    return lresult;
  } catch (...) {
    return (ImVec4_Simple *)0;
  }
}